

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestRequiredForeign::SharedDtor(MessageLite *self)

{
  TestRequired *this;
  NestedTestAllTypes *this_00;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestRequiredForeign *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestRequiredForeign *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (TestRequired *)local_18[3]._vptr_MessageLite;
    if (this != (TestRequired *)0x0) {
      TestRequired::~TestRequired(this);
      operator_delete(this,0xa8);
    }
    this_00 = (NestedTestAllTypes *)local_18[3]._internal_metadata_.ptr_;
    if (this_00 != (NestedTestAllTypes *)0x0) {
      NestedTestAllTypes::~NestedTestAllTypes(this_00);
      operator_delete(this_00,0x50);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
             ,0x4a74,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestRequiredForeign::SharedDtor(MessageLite& self) {
  TestRequiredForeign& this_ = static_cast<TestRequiredForeign&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.optional_message_;
  delete this_._impl_.optional_lazy_message_;
  this_._impl_.~Impl_();
}